

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_entry.hpp
# Opt level: O2

void __thiscall
asio::ip::basic_resolver_entry<asio::ip::tcp>::basic_resolver_entry
          (basic_resolver_entry<asio::ip::tcp> *this,endpoint_type *ep,string_view host,
          string_view service)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  allocator<char> local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_38._M_str = service._M_str;
  local_38._M_len = service._M_len;
  local_28._M_str = host._M_str;
  local_28._M_len = host._M_len;
  uVar1 = *(undefined8 *)&(ep->impl_).data_;
  uVar2 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
  uVar3 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x14);
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 0xc) =
       *(undefined8 *)((long)&(ep->impl_).data_ + 0xc);
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 0x14) = uVar3;
  *(undefined8 *)&(this->endpoint_).impl_.data_ = uVar1;
  *(undefined8 *)((long)&(this->endpoint_).impl_.data_ + 8) = uVar2;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->host_name_,&local_28,&local_39);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->service_name_,&local_38,&local_39);
  return;
}

Assistant:

basic_resolver_entry(const endpoint_type& ep,
      ASIO_STRING_VIEW_PARAM host, ASIO_STRING_VIEW_PARAM service)
    : endpoint_(ep),
      host_name_(static_cast<std::string>(host)),
      service_name_(static_cast<std::string>(service))
  {
  }